

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::operator=
          (ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *this,
          ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *other)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    this->endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,
               (long)pAVar3 - (long)pAVar1 >> 4,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
  other->pos = (RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  other->endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }